

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleRPathChangeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  ulong uVar5;
  allocator<char> local_659;
  undefined1 local_658 [8];
  string message;
  undefined1 local_618 [8];
  ostringstream e_2;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  bool local_449;
  undefined1 local_448 [7];
  bool changed;
  string emsg;
  cmFileTimes ft;
  undefined1 local_418 [7];
  bool success;
  undefined1 local_3f8 [8];
  ostringstream e_1;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  undefined4 local_204;
  string local_200;
  undefined1 local_1e0 [8];
  ostringstream e;
  uint local_58;
  int local_54;
  uint i;
  Doing doing;
  char *newRPath;
  char *oldRPath;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  file.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&oldRPath);
  newRPath = (char *)0x0;
  _i = (char *)0x0;
  local_54 = 0;
  local_58 = 1;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)file.field_2._8_8_);
    if (sVar2 <= local_58) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        if (newRPath == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"RPATH_CHANGE not given OLD_RPATH option.",&local_251);
          cmCommand::SetError(&this->super_cmCommand,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::allocator<char>::~allocator(&local_251);
          this_local._7_1_ = false;
          local_204 = 1;
        }
        else if (_i == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,"RPATH_CHANGE not given NEW_RPATH option.",&local_279);
          cmCommand::SetError(&this->super_cmCommand,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          std::allocator<char>::~allocator(&local_279);
          this_local._7_1_ = false;
          local_204 = 1;
        }
        else {
          bVar1 = cmsys::SystemTools::FileExists((string *)&oldRPath,true);
          if (bVar1) {
            cmFileTimes::cmFileTimes((cmFileTimes *)((long)&emsg.field_2 + 8),(string *)&oldRPath);
            std::__cxx11::string::string((string *)local_448);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_470,newRPath,&local_471);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,_i,&local_499);
            bVar1 = cmSystemTools::ChangeRPath
                              ((string *)&oldRPath,&local_470,&local_498,(string *)local_448,
                               &local_449);
            std::__cxx11::string::~string((string *)&local_498);
            std::allocator<char>::~allocator(&local_499);
            std::__cxx11::string::~string((string *)&local_470);
            std::allocator<char>::~allocator(&local_471);
            bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
              poVar4 = std::operator<<((ostream *)local_618,
                                       "RPATH_CHANGE could not write new RPATH:\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,_i);
              poVar4 = std::operator<<(poVar4,"\n");
              poVar4 = std::operator<<(poVar4,"to the file:\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,(string *)&oldRPath);
              poVar4 = std::operator<<(poVar4,"\n");
              std::operator<<(poVar4,(string *)local_448);
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)((long)&message.field_2 + 8));
              std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
            }
            ft.times._M_t.
            super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t
            .super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
            super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_ = !bVar1;
            if (ft.times._M_t.
                super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>
                .super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_) {
              if ((local_449 & 1U) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_658,"Set runtime path of \"",&local_659);
                std::allocator<char>::~allocator(&local_659);
                std::__cxx11::string::operator+=((string *)local_658,(string *)&oldRPath);
                std::__cxx11::string::operator+=((string *)local_658,"\" to \"");
                std::__cxx11::string::operator+=((string *)local_658,_i);
                std::__cxx11::string::operator+=((string *)local_658,"\"");
                cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,(string *)local_658,-1.0)
                ;
                std::__cxx11::string::~string((string *)local_658);
              }
              cmFileTimes::Store((cmFileTimes *)((long)&emsg.field_2 + 8),(string *)&oldRPath);
            }
            this_local._7_1_ =
                 ft.times._M_t.
                 super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>
                 .super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_;
            local_204 = 1;
            std::__cxx11::string::~string((string *)local_448);
            cmFileTimes::~cmFileTimes((cmFileTimes *)((long)&emsg.field_2 + 8));
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
            poVar4 = std::operator<<((ostream *)local_3f8,"RPATH_CHANGE given FILE \"");
            poVar4 = std::operator<<(poVar4,(string *)&oldRPath);
            std::operator<<(poVar4,"\" that does not exist.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_418);
            std::__cxx11::string::~string((string *)local_418);
            this_local._7_1_ = false;
            local_204 = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"RPATH_CHANGE not given FILE option.",&local_229);
        cmCommand::SetError(&this->super_cmCommand,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator(&local_229);
        this_local._7_1_ = false;
        local_204 = 1;
      }
LAB_003e6932:
      std::__cxx11::string::~string((string *)&oldRPath);
      return this_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)file.field_2._8_8_,(ulong)local_58);
    bVar1 = std::operator==(pvVar3,"OLD_RPATH");
    if (bVar1) {
      local_54 = 2;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)file.field_2._8_8_,(ulong)local_58);
      bVar1 = std::operator==(pvVar3,"NEW_RPATH");
      if (bVar1) {
        local_54 = 3;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)file.field_2._8_8_,(ulong)local_58);
        bVar1 = std::operator==(pvVar3,"FILE");
        if (bVar1) {
          local_54 = 1;
        }
        else {
          if (local_54 == 1) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)file.field_2._8_8_,(ulong)local_58);
            std::__cxx11::string::operator=((string *)&oldRPath,(string *)pvVar3);
          }
          else if (local_54 == 2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)file.field_2._8_8_,(ulong)local_58);
            newRPath = (char *)std::__cxx11::string::c_str();
          }
          else {
            if (local_54 != 3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
              poVar4 = std::operator<<((ostream *)local_1e0,"RPATH_CHANGE given unknown argument ");
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)file.field_2._8_8_,(ulong)local_58);
              std::operator<<(poVar4,(string *)pvVar3);
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_200);
              std::__cxx11::string::~string((string *)&local_200);
              this_local._7_1_ = false;
              local_204 = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
              goto LAB_003e6932;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)file.field_2._8_8_,(ulong)local_58);
            _i = (char *)std::__cxx11::string::c_str();
          }
          local_54 = 0;
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

bool cmFileCommand::HandleRPathChangeCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  std::string file;
  const char* oldRPath = nullptr;
  const char* newRPath = nullptr;
  enum Doing
  {
    DoingNone,
    DoingFile,
    DoingOld,
    DoingNew
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "OLD_RPATH") {
      doing = DoingOld;
    } else if (args[i] == "NEW_RPATH") {
      doing = DoingNew;
    } else if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i];
      doing = DoingNone;
    } else if (doing == DoingOld) {
      oldRPath = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingNew) {
      newRPath = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_CHANGE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (file.empty()) {
    this->SetError("RPATH_CHANGE not given FILE option.");
    return false;
  }
  if (!oldRPath) {
    this->SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
  }
  if (!newRPath) {
    this->SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    std::ostringstream e;
    e << "RPATH_CHANGE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }
  bool success = true;
  cmFileTimes const ft(file);
  std::string emsg;
  bool changed;
  if (!cmSystemTools::ChangeRPath(file, oldRPath, newRPath, &emsg, &changed)) {
    std::ostringstream e;
    /* clang-format off */
    e << "RPATH_CHANGE could not write new RPATH:\n"
      << "  " << newRPath << "\n"
      << "to the file:\n"
      << "  " << file << "\n"
      << emsg;
    /* clang-format on */
    this->SetError(e.str());
    success = false;
  }
  if (success) {
    if (changed) {
      std::string message = "Set runtime path of \"";
      message += file;
      message += "\" to \"";
      message += newRPath;
      message += "\"";
      this->Makefile->DisplayStatus(message, -1);
    }
    ft.Store(file);
  }
  return success;
}